

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O0

void __thiscall
AlphaVector::SetValues(AlphaVector *this,vector<double,_std::allocator<double>_> *vs)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 uVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  char *in_RDI;
  E *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  char *arg;
  
  arg = in_RDI;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10));
  if (sVar1 != sVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,arg);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

void AlphaVector::SetValues(const vector<double> &vs)
{
    if(vs.size()!=_m_values.size())
        throw(E("AlphaVector::SetValues vector sizes do not match"));
    else
        _m_values=vs;
}